

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

tuple<long,_long> calcSum<stSampleMulti<short,4>>(TWaveformViewT<TSampleMI16> *waveform)

{
  long lVar1;
  _Head_base<0UL,_long,_false> extraout_RDX;
  long in_RSI;
  _Tuple_impl<1UL,_long> in_RDI;
  tuple<long,_long> tVar2;
  int32_t a0;
  int j;
  int is;
  int64_t n;
  stSampleMulti<short,_4> *samples;
  int64_t sum2;
  int64_t sum;
  long *in_stack_ffffffffffffffa8;
  _Head_base<1UL,_long,_false> this;
  undefined4 local_38;
  undefined4 local_34;
  
  lVar1 = *(long *)(in_RSI + 8);
  this = in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  for (local_34 = 0; local_34 < lVar1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      std::array<short,_4UL>::operator[]
                ((array<short,_4UL> *)this._M_head_impl,(size_type)in_stack_ffffffffffffffa8);
    }
  }
  std::tuple<long,_long>::tuple<long_&,_long_&,_true>
            ((tuple<long,_long> *)this._M_head_impl,in_stack_ffffffffffffffa8,(long *)0x19d711);
  tVar2.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<long,_long>)tVar2.super__Tuple_impl<0UL,_long,_long>;
}

Assistant:

std::tuple<int64_t, int64_t> calcSum(const TWaveformViewT<TSampleMI16> & waveform) {
    int64_t sum = 0;
    int64_t sum2 = 0;

    auto samples = waveform.samples;
    auto n       = waveform.n;

    for (int is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples[is][j];
            sum += a0;
            sum2 += a0*a0;
        }
    }

    return std::tuple<int64_t, int64_t>(sum, sum2);
}